

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QString * __thiscall
QDateTime::timeZoneAbbreviation(QString *__return_storage_ptr__,QDateTime *this)

{
  QDateTimePrivate *this_00;
  ulong millis;
  uint uVar1;
  QDateTimePrivate *pQVar2;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_68;
  QStringBuilder<QLatin1String,_QString> local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d;
  if (((ulong)pQVar2 & 1) == 0) {
    uVar1 = (pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    if ((uVar1 & 8) == 0) {
LAB_0030ea55:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_0030ebdf;
    }
  }
  else {
    if (((ulong)pQVar2 & 8) == 0) goto LAB_0030ea55;
    uVar1 = (uint)pQVar2;
  }
  switch(uVar1 >> 4 & 3) {
  case 0:
    if (((ulong)pQVar2 & 1) == 0) {
      this_00 = (QDateTimePrivate *)pQVar2->m_msecs;
      pQVar2 = (QDateTimePrivate *)
               (ulong)(pQVar2->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    else {
      this_00 = (QDateTimePrivate *)((long)pQVar2 >> 8);
    }
    millis = 1;
    if (-1 < (char)pQVar2) {
      millis = (ulong)((((uint)pQVar2 >> 6 & 1) != 0) - 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0030ebdf:
      __stack_chk_fail();
    }
    QDateTimePrivate::localNameAtMillis
              (__return_storage_ptr__,this_00,millis,(DaylightStatus)*(long *)(in_FS_OFFSET + 0x28))
    ;
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0030ebdf;
    latin1.m_data = "UTC";
    latin1.m_size = 3;
    QString::QString(__return_storage_ptr__,latin1);
    break;
  case 2:
    toOffsetString((QString *)&local_68,ISODate,pQVar2->m_offsetFromUtc);
    local_48.b.d.size = local_68.size;
    local_48.b.d.ptr = local_68.ptr;
    local_48.b.d.d = local_68.d;
    local_48.a.m_size = 3;
    local_48.a.m_data = "UTC";
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>(__return_storage_ptr__,&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0030ebdf;
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0030ebdf;
    QTimeZone::abbreviation(__return_storage_ptr__,&pQVar2->m_timeZone,this);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QDateTime::timeZoneAbbreviation() const
{
    if (!isValid())
        return QString();

    switch (getSpec(d)) {
    case Qt::UTC:
        return "UTC"_L1;
    case Qt::OffsetFromUTC:
        return "UTC"_L1 + toOffsetString(Qt::ISODate, d->m_offsetFromUtc);
    case Qt::TimeZone:
#if !QT_CONFIG(timezone)
        break;
#else
        Q_ASSERT(d->m_timeZone.isValid());
        return d->m_timeZone.abbreviation(*this);
#endif // timezone
    case Qt::LocalTime:
#if defined(Q_OS_WIN) && QT_CONFIG(timezone)
        // MS's tzname is a full MS-name, not an abbreviation:
        if (QString sys = QTimeZone::systemTimeZone().abbreviation(*this); !sys.isEmpty())
            return sys;
        // ... but, even so, a full name isn't as bad as empty.
#endif
        return QDateTimePrivate::localNameAtMillis(getMSecs(d),
                                                   extractDaylightStatus(getStatus(d)));
    }
    return QString();
}